

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O2

uint32_t * __thiscall
vsencoding::VSEncoding::compute_OptPartition
          (VSEncoding *this,uint32_t *seq,uint32_t len,uint32_t fixCost,uint32_t *pSize)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint32_t uVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  uint32_t *puVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint32_t uVar16;
  uint uVar17;
  uint32_t uVar18;
  long lVar19;
  int iVar20;
  
  uVar14 = (ulong)(len + 1);
  pvVar6 = operator_new__(uVar14 * 4);
  pvVar7 = operator_new__(uVar14 * 8);
  for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
    *(undefined4 *)((long)pvVar6 + uVar8 * 4) = 0xffffffff;
    *(undefined8 *)((long)pvVar7 + uVar8 * 8) = 0;
  }
  uVar5 = this->maxBlk;
  bVar1 = this->aligned;
  puVar9 = this->posszLens;
  puVar3 = this->possLens;
  uVar8 = 0;
  uVar2 = this->poss_sz;
  do {
    uVar16 = (uint32_t)uVar8;
    if (uVar16 == len) {
      uVar11 = 0;
      for (uVar5 = len; uVar5 != 0; uVar5 = *(uint32_t *)((long)pvVar6 + (long)(int)uVar5 * 4)) {
        uVar11 = uVar11 + 1;
      }
      *pSize = uVar11;
      puVar9 = (uint32_t *)operator_new__((ulong)(uVar11 + 1) << 2);
      for (; len != 0; len = *(uint32_t *)((long)pvVar6 + (long)(int)len * 4)) {
        puVar9[uVar11] = len;
        uVar11 = uVar11 - 1;
      }
      *puVar9 = 0;
      operator_delete__(pvVar6);
      operator_delete__(pvVar7);
      return puVar9;
    }
    uVar17 = uVar16 + 1;
    uVar8 = (ulong)uVar17;
    iVar20 = 0;
    uVar12 = uVar17 - uVar5;
    uVar4 = ~((int)uVar12 >> 0x1f) & uVar12;
    uVar18 = 1;
    iVar10 = 0;
    uVar11 = 0;
    for (lVar19 = (long)(int)uVar16; (int)uVar4 <= lVar19; lVar19 = lVar19 + -1) {
      uVar13 = seq[lVar19];
      if (seq[lVar19] < uVar11) {
        uVar13 = uVar11;
      }
      if (puVar9 == (uint32_t *)0x0) {
LAB_001115b7:
        if (uVar18 == puVar3[iVar10]) {
          iVar10 = iVar10 + 1;
LAB_001115bf:
          uVar11 = uVar13 * uVar18 + 0x1f >> 5;
          if ((bVar1 & 1U) == 0) {
            uVar11 = uVar13 * uVar18;
          }
          uVar14 = (ulong)uVar11 + (ulong)fixCost + *(long *)((long)pvVar7 + lVar19 * 8);
          if (*(int *)((long)pvVar6 + uVar8 * 4) == -1) {
            uVar15 = uVar14 + 1;
            *(ulong *)((long)pvVar7 + uVar8 * 8) = uVar15;
          }
          else {
            uVar15 = *(ulong *)((long)pvVar7 + uVar8 * 8);
          }
          if (uVar14 <= uVar15) {
            *(ulong *)((long)pvVar7 + uVar8 * 8) = uVar14;
            *(int *)((long)pvVar6 + uVar8 * 4) = (int)lVar19;
          }
        }
      }
      else {
        if (uVar13 != 0) {
          if ((int)uVar12 < 1) {
            uVar4 = 0;
          }
          else {
            uVar4 = uVar17 - puVar3[uVar2 - 1];
          }
          goto LAB_001115b7;
        }
        iVar10 = iVar10 + (uint)(uVar18 == puVar3[iVar10]);
        if (uVar18 == puVar9[iVar20]) {
          iVar20 = iVar20 + 1;
          goto LAB_001115bf;
        }
      }
      uVar18 = uVar18 + 1;
      uVar11 = uVar13;
    }
  } while( true );
}

Assistant:

inline uint32_t *VSEncoding::compute_OptPartition(uint32_t *seq, uint32_t len,
                                           uint32_t fixCost, uint32_t &pSize) {
  int *SSSP;
  uint32_t i;
  uint32_t maxB;
  uint32_t *part;
  uint64_t curCost;
  uint64_t *cost;

  /* It will store the shortest path */
  SSSP = new int[len + 1];

  /* cost[i] will contain the cost of encoding up to i-th position */
  cost = new uint64_t[len + 1];

  if (SSSP == NULL || cost == NULL)
    fprintf(stderr, "Can't allocate memory\n");

  for (i = 0; i < len + 1U; ++i) {
    SSSP[i] = -1;
    cost[i] = 0;
  }

  /*
   * This loop computes the cost of the optimal partition.
   * The computation of the max log in each block is done
   * by scanning. Probably we could obtain a faster solution
   * by using RMQ data structures. We use this trivial
   * solution since construction time is not our main concern.
   */
  {
    int mleft;
    int j;
    int g;
    int l;

    for (i = 0U; i < len;) {
      ++i; // rewrite to avoid possibly infinite loop warning
      mleft = (static_cast<int>(i - maxBlk) > 0) ? i - maxBlk : 0;

      for (maxB = 0, l = 0, g = 0, j = i - 1; j >= mleft; j--) {
        if (maxB < seq[j])
          maxB = seq[j];

        if (posszLens == NULL) {
          /*
           * FIXME: If the gaps of elements in possLens[] are
           * sparse, a process below is more efficient to hop
           * these gaps using the elements rather than
           * decrementing j.
           */
          if (i - j != possLens[l])
            continue;
          else
            l++;
        } else {
          /*
           * Treat runs of 0 in a different way.
           * They could form larger blocks!
           */
          if (maxB != 0) {
            mleft = (static_cast<int>(i - maxBlk) > 0)
                        ? i - possLens[poss_sz - 1]
                        : 0;

            if (i - j != possLens[l])
              continue;

            if (i - j == possLens[l])
              l++;
          } else {
            if (i - j == possLens[l])
              l++;

            if (i - j != posszLens[g])
              continue;

            if (i - j == posszLens[g])
              g++;
          }
        }

        /* Caluculate costs */
        if (aligned)
          curCost = cost[j] + div_roundup((i - j) * maxB, 32) + fixCost;
        else
          curCost = cost[j] + (i - j) * maxB + fixCost;

        if (SSSP[i] == -1)
          cost[i] = curCost + 1;

        if (curCost <= cost[i]) {
          cost[i] = curCost;
          SSSP[i] = j;
        }
      }
    }
  }

  /* Compute number of nodes in the path */
  {
    int next;

    pSize = 0;
    next = len;

    while (next != 0) {
      next = SSSP[next];
      pSize++;
    }

    /*
     * Obtain the optimal partition starting
     * from the last block.
     */
    part = new uint32_t[pSize + 1];

    if (part == NULL) {
      /* Finalization */
      delete[] SSSP;
      delete[] cost;
      throw std::runtime_error("Can't allocate memory");
    }

    i = pSize;
    next = len;

    while (next != 0) {
      part[i--] = next;
      next = SSSP[next];
    }

    part[0] = 0;
  }

  /* Finalization */
  delete[] SSSP;
  delete[] cost;

  return part;
}